

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O2

VP8StatusCode GetFeatures(uint8_t *data,size_t data_size,WebPBitstreamFeatures *features)

{
  VP8StatusCode VVar1;
  
  if (data == (uint8_t *)0x0 || features == (WebPBitstreamFeatures *)0x0) {
    return VP8_STATUS_INVALID_PARAM;
  }
  features->format = 0;
  features->pad[0] = 0;
  features->pad[1] = 0;
  features->pad[2] = 0;
  features->width = 0;
  features->height = 0;
  features->has_alpha = 0;
  features->has_animation = 0;
  features->pad[3] = 0;
  features->pad[4] = 0;
  VVar1 = ParseHeadersInternal
                    (data,data_size,&features->width,&features->height,&features->has_alpha,
                     &features->has_animation,&features->format,(WebPHeaderStructure *)0x0);
  return VVar1;
}

Assistant:

static VP8StatusCode GetFeatures(const uint8_t* const data, size_t data_size,
                                 WebPBitstreamFeatures* const features) {
  if (features == NULL || data == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  DefaultFeatures(features);

  // Only parse enough of the data to retrieve the features.
  return ParseHeadersInternal(data, data_size,
                              &features->width, &features->height,
                              &features->has_alpha, &features->has_animation,
                              &features->format, NULL);
}